

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

void despot::AEMS::Expand
               (QNode *qnode,BeliefLowerBound *lb,BeliefUpperBound *ub,BeliefMDP *model,
               History *history)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  VNode *this;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_00;
  Belief *pBVar7;
  pointer ppVar8;
  void *this_01;
  VNode *this_02;
  undefined4 extraout_var;
  log_ostream *plVar9;
  ostream *poVar10;
  mapped_type *ppVVar11;
  size_t extraout_XMM0_Qa;
  double dVar12;
  double dVar13;
  VNode *vnode;
  double weight;
  OBS_TYPE obs;
  _Self local_b0;
  iterator it;
  double upper_bound;
  double lower_bound;
  undefined1 local_88 [8];
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  obss;
  double step_reward;
  Belief *belief;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *children;
  ACT_TYPE action;
  VNode *parent;
  History *history_local;
  BeliefMDP *model_local;
  BeliefUpperBound *ub_local;
  BeliefLowerBound *lb_local;
  QNode *qnode_local;
  
  this = QNode::parent(qnode);
  uVar3 = QNode::edge(qnode);
  this_00 = QNode::children(qnode);
  pBVar7 = VNode::belief(this);
  uVar4 = QNode::edge(qnode);
  (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1e])(model,pBVar7,(ulong)uVar4);
  obss._M_t._M_impl.super__Rb_tree_header._M_node_count = extraout_XMM0_Qa;
  std::
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::map((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
         *)local_88);
  uVar4 = QNode::edge(qnode);
  (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1d])(model,pBVar7,(ulong)uVar4,local_88);
  upper_bound = (double)obss._M_t._M_impl.super__Rb_tree_header._M_node_count;
  it._M_node = (_Base_ptr)obss._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ::begin((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                *)local_88);
  while( true ) {
    obs = (OBS_TYPE)
          std::
          map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
          ::end((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                 *)local_88);
    bVar2 = std::operator!=(&local_b0,(_Self *)&obs);
    if (!bVar2) break;
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_>::operator->(&local_b0);
    weight = (double)ppVar8->first;
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_>::operator->(&local_b0);
    dVar1 = ppVar8->second;
    iVar5 = logging::level();
    if ((0 < iVar5) && (iVar5 = logging::level(), 3 < iVar5)) {
      plVar9 = logging::stream(4);
      poVar10 = std::operator<<(&plVar9->super_ostream,"[AEMS::Expand] Creating node for obs ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(ulong)weight);
      poVar10 = std::operator<<(poVar10," with weight ");
      this_01 = (void *)std::ostream::operator<<(poVar10,dVar1);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
    this_02 = (VNode *)operator_new(0x98);
    iVar5 = (*(model->super_DSPOMDP)._vptr_DSPOMDP[0x1c])(model,pBVar7,(ulong)uVar3,weight);
    iVar6 = VNode::depth(this);
    VNode::VNode(this_02,(Belief *)CONCAT44(extraout_var,iVar5),iVar6 + 1,qnode,(OBS_TYPE)weight);
    this_02->likelihood = dVar1;
    iVar5 = logging::level();
    if ((0 < iVar5) && (iVar5 = logging::level(), 3 < iVar5)) {
      plVar9 = logging::stream(4);
      poVar10 = std::operator<<(&plVar9->super_ostream," New node created!");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    ppVVar11 = std::
               map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
               ::operator[](this_00,(key_type *)&weight);
    *ppVVar11 = this_02;
    InitLowerBound(this_02,lb,history);
    InitUpperBound(this_02,ub,history);
    dVar12 = Globals::Discount();
    dVar13 = VNode::lower_bound(this_02);
    upper_bound = dVar1 * dVar12 * dVar13 + upper_bound;
    dVar12 = Globals::Discount();
    dVar13 = VNode::upper_bound(this_02);
    it._M_node = (_Base_ptr)(dVar1 * dVar12 * dVar13 + it._M_node);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_>::operator++(&local_b0,0);
  }
  qnode->step_reward = (double)obss._M_t._M_impl.super__Rb_tree_header._M_node_count;
  QNode::lower_bound(qnode,upper_bound);
  QNode::upper_bound(qnode,(double)it._M_node);
  std::
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ::~map((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
          *)local_88);
  return;
}

Assistant:

void AEMS::Expand(QNode* qnode, BeliefLowerBound* lb, BeliefUpperBound* ub,
	const BeliefMDP* model, History& history) {
	VNode* parent = qnode->parent();
	ACT_TYPE action = qnode->edge();
	map<OBS_TYPE, VNode*>& children = qnode->children();

	const Belief* belief = parent->belief();
	// cout << *belief << endl;

	double step_reward = model->StepReward(belief, qnode->edge());

	map<OBS_TYPE, double> obss;
	model->Observe(belief, qnode->edge(), obss);

	double lower_bound = step_reward;
	double upper_bound = step_reward;

	// Create new belief nodes
	for (map<OBS_TYPE, double>::iterator it = obss.begin(); it != obss.end(); it++) {
		OBS_TYPE obs = it->first;
		double weight = it->second;
		logd << "[AEMS::Expand] Creating node for obs " << obs
			<< " with weight " << weight << endl;
		VNode* vnode = new VNode(model->Tau(belief, action, obs),
			parent->depth() + 1, qnode, obs);
		vnode->likelihood = weight;
		logd << " New node created!" << endl;
		children[obs] = vnode;

		InitLowerBound(vnode, lb, history);
		InitUpperBound(vnode, ub, history);

		lower_bound += weight * Globals::Discount() * vnode->lower_bound();
		upper_bound += weight * Globals::Discount() * vnode->upper_bound();
	}

	qnode->step_reward = step_reward;
	qnode->lower_bound(lower_bound);
	qnode->upper_bound(upper_bound);
}